

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O2

walk_result __thiscall
jsoncons::jsonschema::
not_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::do_validate(not_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *this,eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *context,
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *instance,
             json_pointer *instance_location,evaluation_results *results,error_reporter *reporter,
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *patch)

{
  long *plVar1;
  int iVar2;
  walk_result wVar3;
  allocator<char> local_221;
  error_reporter *local_220;
  string local_218 [32];
  collecting_error_listener local_reporter;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  this_context;
  evaluation_results local_results;
  validation_message local_148;
  
  local_220 = reporter;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::eval_context(&this_context,context,
                 &(this->
                  super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  ).
                  super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  .keyword_name_);
  local_results.evaluated_properties._M_h._M_buckets =
       &local_results.evaluated_properties._M_h._M_single_bucket;
  local_results.evaluated_properties._M_h._M_bucket_count = 1;
  local_results.evaluated_properties._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_results.evaluated_properties._M_h._M_element_count = 0;
  local_results.evaluated_properties._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_results.evaluated_properties._M_h._M_rehash_policy._M_next_resize = 0;
  local_results.evaluated_properties._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_results.evaluated_items.ranges_.
  super__Vector_base<jsoncons::jsonschema::range,_std::allocator<jsoncons::jsonschema::range>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_results.evaluated_items.ranges_.
  super__Vector_base<jsoncons::jsonschema::range,_std::allocator<jsoncons::jsonschema::range>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_results.evaluated_items.ranges_.
  super__Vector_base<jsoncons::jsonschema::range,_std::allocator<jsoncons::jsonschema::range>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_reporter.super_error_reporter.error_count_ = 0;
  local_reporter.super_error_reporter._vptr_error_reporter =
       (_func_int **)&PTR__collecting_error_listener_009a4f30;
  local_reporter.errors.
  super__Vector_base<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_reporter.errors.
  super__Vector_base<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_reporter.errors.
  super__Vector_base<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  plVar1 = *(long **)&(this->
                      super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                      ).field_0xe0;
  iVar2 = (**(code **)(*plVar1 + 0x28))
                    (plVar1,&this_context,instance,instance_location,&local_results,&local_reporter,
                     patch);
  wVar3 = abort;
  if (iVar2 != 1) {
    if (local_reporter.errors.
        super__Vector_base<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_reporter.errors.
        super__Vector_base<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_218,"Instance must not be valid against schema",&local_221);
      (*(this->
        super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        ).
        super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        .super_validation_message_factory._vptr_validation_message_factory[2])
                (&local_148,this,&this_context.eval_path_,instance_location,local_218);
      local_220->error_count_ = local_220->error_count_ + 1;
      iVar2 = (*local_220->_vptr_error_reporter[2])(local_220,&local_148);
      validation_message::~validation_message(&local_148);
      std::__cxx11::string::~string(local_218);
      if (iVar2 == 1) goto LAB_00396d4d;
    }
    else {
      evaluation_results::merge(results,&local_results);
    }
    wVar3 = advance;
  }
LAB_00396d4d:
  collecting_error_listener::~collecting_error_listener(&local_reporter);
  evaluation_results::~evaluation_results(&local_results);
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::~eval_context(&this_context);
  return wVar3;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& results, 
            error_reporter& reporter, 
            Json& patch) const final
        {
            eval_context<Json> this_context(context, this->keyword_name());

            evaluation_results local_results;
            collecting_error_listener local_reporter;
            walk_result result = schema_val_->validate(this_context, instance, instance_location, local_results, local_reporter, patch);
            if (result == walk_result::abort)
            {
                return result;
            }

            if (local_reporter.errors.empty())
            {
                result = reporter.error(this->make_validation_message(
                    this_context.eval_path(),
                    instance_location, 
                    "Instance must not be valid against schema"));
                if (result == walk_result::abort)
                {
                    return result;
                }
            }
            else
            {
                results.merge(local_results);
            }
            return walk_result::advance;
        }